

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ListeningReporter::reportInvalidArguments(ListeningReporter *this,string *arg)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter> *listener;
  pointer puVar3;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_listeners).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = puVar3->m_ptr;
    if (pIVar2 == (IStreamingReporter *)0x0) goto LAB_0019ccae;
    (*pIVar2->_vptr_IStreamingReporter[3])(pIVar2,arg);
  }
  pIVar2 = (this->m_reporter).m_ptr;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*pIVar2->_vptr_IStreamingReporter[3])(pIVar2,arg);
    return;
  }
LAB_0019ccae:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                ,0x4b8,
                "T *Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator->() const [T = Catch::IStreamingReporter]"
               );
}

Assistant:

void ListeningReporter::reportInvalidArguments(std::string const &arg) {
        for (auto const &listener : m_listeners) {
            listener->reportInvalidArguments(arg);
        }
        m_reporter->reportInvalidArguments(arg);
    }